

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void cfv4e_cpu_initfn(CPUState *obj)

{
  CPUM68KState_conflict *env_00;
  CPUM68KState_conflict *env;
  M68kCPU *cpu;
  CPUState *obj_local;
  
  env_00 = (CPUM68KState_conflict *)(obj[1].tb_jmp_cache + 0x8f);
  m68k_set_feature(env_00,5);
  m68k_set_feature(env_00,6);
  m68k_set_feature(env_00,8);
  m68k_set_feature(env_00,9);
  m68k_set_feature(env_00,0xb);
  m68k_set_feature(env_00,0xd);
  return;
}

Assistant:

static void cfv4e_cpu_initfn(CPUState *obj)
{
    M68kCPU *cpu = M68K_CPU(obj);
    CPUM68KState *env = &cpu->env;

    m68k_set_feature(env, M68K_FEATURE_CF_ISA_A);
    m68k_set_feature(env, M68K_FEATURE_CF_ISA_B);
    m68k_set_feature(env, M68K_FEATURE_BRAL);
    m68k_set_feature(env, M68K_FEATURE_CF_FPU);
    m68k_set_feature(env, M68K_FEATURE_CF_EMAC);
    m68k_set_feature(env, M68K_FEATURE_USP);
}